

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Array2D<float> *f,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  SummedAreaTable::integrate((Array2D<double> *)this,&this->sat,f,alloc);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (f->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (f->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar1 = vpsubd_avx(auVar1,auVar2);
  Array2D<float>::Array2D<float_const*,void>
            (&this->func,f->values,f->values + auVar1._4_4_ * auVar1._0_4_,auVar1._0_4_,auVar1._4_4_
             ,(allocator_type)alloc.memoryResource);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Array2D<Float> f, Allocator alloc = {})
        : sat(f, alloc), func(f, alloc) {}